

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message.cpp
# Opt level: O3

ByteBuffer * __thiscall
bidfx_public_api::price::pixie::LoginMessage::Encode
          (ByteBuffer *__return_storage_ptr__,LoginMessage *this,int version)

{
  OutputStream *stream;
  pointer pcVar1;
  long lVar2;
  size_t size;
  ByteBuffer message_frame;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  ByteBuffer local_60;
  
  lVar2 = 0;
  if (1 < version) {
    lVar2 = (this->application_version_)._M_string_length + (this->application_)._M_string_length;
  }
  size = lVar2 + (this->username_)._M_string_length + (this->alias_)._M_string_length +
                 (this->password_)._M_string_length * 2 + 1;
  if (3 < version) {
    size = size + (this->api_)._M_string_length + (this->api_version_)._M_string_length +
           (this->product_)._M_string_length + (this->product_serial_number_)._M_string_length;
  }
  tools::ByteBuffer::ByteBuffer(&local_60,size);
  tools::ByteBuffer::WriteByte(&local_60,'L');
  pcVar1 = (this->username_)._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (this->username_)._M_string_length);
  stream = &local_60.super_OutputStream;
  tools::Varint::WriteString(stream,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (this->password_)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + (this->password_)._M_string_length);
  tools::Varint::WriteString(stream,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (this->alias_)._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + (this->alias_)._M_string_length);
  tools::Varint::WriteString(stream,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (1 < version) {
    pcVar1 = (this->application_)._M_dataplus._M_p;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar1,pcVar1 + (this->application_)._M_string_length);
    tools::Varint::WriteString(stream,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (this->application_version_)._M_dataplus._M_p;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar1,pcVar1 + (this->application_version_)._M_string_length);
    tools::Varint::WriteString(stream,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  if (3 < version) {
    pcVar1 = (this->api_)._M_dataplus._M_p;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar1,pcVar1 + (this->api_)._M_string_length);
    tools::Varint::WriteString(stream,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (this->api_version_)._M_dataplus._M_p;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar1,pcVar1 + (this->api_version_)._M_string_length);
    tools::Varint::WriteString(stream,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (this->product_)._M_dataplus._M_p;
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,pcVar1,pcVar1 + (this->product_)._M_string_length);
    tools::Varint::WriteString(stream,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (this->product_serial_number_)._M_dataplus._M_p;
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,pcVar1,pcVar1 + (this->product_serial_number_)._M_string_length)
    ;
    tools::Varint::WriteString(stream,&local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
  }
  tools::ByteBuffer::ByteBuffer(__return_storage_ptr__,&local_60);
  tools::ByteBuffer::~ByteBuffer(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ByteBuffer LoginMessage::Encode(int version) const
{
    size_t message_len = sizeof(PixieMessageType::LOGIN) + sizeof(unsigned char) * username_.size() +
                      sizeof(unsigned char) * password_.size() + sizeof(unsigned char) * alias_.size() +
                      sizeof(unsigned char) * password_.size();

    bool version2 = version >= PixieVersion::VERSION2;
    if (version2)
    {
        message_len += sizeof(unsigned char) * application_.size() + sizeof(unsigned char) * application_version_.size();
    }

    bool version4 = version >= PixieVersion::VERSION4;
    if (version4)
    {
        message_len += sizeof(unsigned char) * api_.size() + sizeof(unsigned char) * api_version_.size() +
                       sizeof(unsigned char) * product_.size() + sizeof(unsigned char) * product_serial_number_.size();
    }

    ByteBuffer message_frame(message_len);
    message_frame.WriteByte(PixieMessageType::LOGIN);
    Varint::WriteString(message_frame, username_);
    Varint::WriteString(message_frame, password_);
    Varint::WriteString(message_frame, alias_);

    if (version2)
    {
        Varint::WriteString(message_frame, application_);
        Varint::WriteString(message_frame, application_version_);
    }

    if (version4)
    {
        Varint::WriteString(message_frame, api_);
        Varint::WriteString(message_frame, api_version_);
        Varint::WriteString(message_frame, product_);
        Varint::WriteString(message_frame, product_serial_number_);
    }

    return std::move(message_frame);
}